

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_input_type
          (CompilerMSL *this,uint32_t type_id,uint32_t location,uint32_t num_components)

{
  MSLShaderInputFormat MVar1;
  int iVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer ppVar5;
  CompilerError *pCVar6;
  uint32_t local_e4;
  uint32_t local_c8;
  uint32_t local_c0;
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  _Self local_40;
  _Self local_38;
  iterator p_va;
  SPIRType *type;
  uint32_t local_20;
  uint32_t num_components_local;
  uint32_t location_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  local_20 = location;
  num_components_local = type_id;
  _location_local = this;
  p_va._M_node = (_Base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  local_38._M_node =
       (_Base_ptr)
       ::std::
       map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
       ::find(&this->inputs_by_location,&local_20);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       end<std::map<unsigned_int,spirv_cross::MSLShaderInput,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::MSLShaderInput>>>>
                 (&this->inputs_by_location);
  bVar3 = ::std::operator==(&local_38,&local_40);
  if (bVar3) {
    if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < num_components) {
      this_local._4_4_ =
           build_extended_vector_type(this,num_components_local,num_components,Unknown);
    }
    else {
      this_local._4_4_ = num_components_local;
    }
  }
  else {
    type._4_4_ = num_components;
    if (num_components == 0) {
      ppVar5 = ::std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>
               ::operator->(&local_38);
      type._4_4_ = (ppVar5->second).vecsize;
    }
    ppVar5 = ::std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>::
             operator->(&local_38);
    MVar1 = (ppVar5->second).format;
    if (MVar1 == MSL_SHADER_INPUT_FORMAT_UINT8) {
      switch(*(undefined4 *)((long)&(p_va._M_node)->_M_parent + 4)) {
      case 4:
      case 6:
      case 8:
        if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < type._4_4_) {
          this_local._4_4_ =
               build_extended_vector_type(this,num_components_local,type._4_4_,Unknown);
        }
        else {
          this_local._4_4_ = num_components_local;
        }
        break;
      case 5:
        if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < type._4_4_) {
          local_c0 = type._4_4_;
        }
        else {
          local_c0 = *(uint32_t *)((long)&(p_va._M_node)->_M_left + 4);
        }
        this_local._4_4_ = build_extended_vector_type(this,num_components_local,local_c0,UShort);
        break;
      case 7:
        if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < type._4_4_) {
          local_c8 = type._4_4_;
        }
        else {
          local_c8 = *(uint32_t *)((long)&(p_va._M_node)->_M_left + 4);
        }
        this_local._4_4_ = build_extended_vector_type(this,num_components_local,local_c8,UInt);
        break;
      default:
        local_75 = 1;
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_60,"Vertex attribute type mismatch between host and shader",&local_61);
        CompilerError::CompilerError(pCVar6,(string *)local_60);
        local_75 = 0;
        __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    else if (MVar1 == MSL_SHADER_INPUT_FORMAT_UINT16) {
      iVar2 = *(int *)((long)&(p_va._M_node)->_M_parent + 4);
      if (iVar2 != 6) {
        if (iVar2 == 7) {
          if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < type._4_4_) {
            local_e4 = type._4_4_;
          }
          else {
            local_e4 = *(uint32_t *)((long)&(p_va._M_node)->_M_left + 4);
          }
          uVar4 = build_extended_vector_type(this,num_components_local,local_e4,UInt);
          return uVar4;
        }
        if (iVar2 != 8) {
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_98,"Vertex attribute type mismatch between host and shader",&local_99);
          CompilerError::CompilerError(pCVar6,(string *)local_98);
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < type._4_4_) {
        this_local._4_4_ = build_extended_vector_type(this,num_components_local,type._4_4_,Unknown);
      }
      else {
        this_local._4_4_ = num_components_local;
      }
    }
    else {
      if (*(uint *)((long)&(p_va._M_node)->_M_left + 4) < type._4_4_) {
        num_components_local =
             build_extended_vector_type(this,num_components_local,type._4_4_,Unknown);
      }
      this_local._4_4_ = num_components_local;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_input_type(uint32_t type_id, uint32_t location, uint32_t num_components)
{
	auto &type = get<SPIRType>(type_id);

	auto p_va = inputs_by_location.find(location);
	if (p_va == end(inputs_by_location))
	{
		if (num_components > type.vecsize)
			return build_extended_vector_type(type_id, num_components);
		else
			return type_id;
	}

	if (num_components == 0)
		num_components = p_va->second.vecsize;

	switch (p_va->second.format)
	{
	case MSL_SHADER_INPUT_FORMAT_UINT8:
	{
		switch (type.basetype)
		{
		case SPIRType::UByte:
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Short:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UShort);
		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	case MSL_SHADER_INPUT_FORMAT_UINT16:
	{
		switch (type.basetype)
		{
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	default:
		if (num_components > type.vecsize)
			type_id = build_extended_vector_type(type_id, num_components);
		break;
	}

	return type_id;
}